

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O1

void __thiscall avro::UnionSchema::addType(UnionSchema *this,Schema *typeSchema)

{
  Type TVar1;
  element_type *peVar2;
  Node *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Name *this_01;
  undefined4 extraout_var_01;
  ulong uVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  TVar1 = ((typeSchema->node_).px)->type_;
  if (TVar1 == AVRO_RECORD) {
    iVar4 = (*((this->super_Schema).node_.px)->_vptr_Node[4])();
    if (CONCAT44(extraout_var,iVar4) != 0) {
      uVar7 = 0;
      do {
        peVar2 = (this->super_Schema).node_.px;
        iVar5 = (*peVar2->_vptr_Node[5])(peVar2,uVar7 & 0xffffffff);
        if ((int)(*(long **)CONCAT44(extraout_var_00,iVar5))[1] == 8) {
          this_01 = (Name *)(**(code **)(**(long **)CONCAT44(extraout_var_00,iVar5) + 0x18))();
          iVar5 = (*((typeSchema->node_).px)->_vptr_Node[3])();
          bVar3 = Name::operator==(this_01,(Name *)CONCAT44(extraout_var_01,iVar5));
          if (bVar3) {
            puVar6 = (undefined8 *)__cxa_allocate_exception(0x18);
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"Records in unions cannot have duplicate names","");
            std::runtime_error::runtime_error((runtime_error *)(puVar6 + 1),(string *)local_50);
            *puVar6 = 0x1917f0;
            puVar6[1] = 0x191820;
            __cxa_throw(puVar6,&Exception::typeinfo,Exception::~Exception);
          }
        }
        uVar7 = uVar7 + 1;
      } while (CONCAT44(extraout_var,iVar4) != uVar7);
    }
  }
  else if (TVar1 == AVRO_UNION) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Cannot add unions to unions","");
    std::runtime_error::runtime_error((runtime_error *)(puVar6 + 1),(string *)local_50);
    *puVar6 = 0x1917f0;
    puVar6[1] = 0x191820;
    __cxa_throw(puVar6,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = (this->super_Schema).node_.px;
  Node::checkLock(this_00);
  (*this_00->_vptr_Node[0x12])(this_00,&typeSchema->node_);
  return;
}

Assistant:

void
UnionSchema::addType(const Schema &typeSchema) 
{
    if(typeSchema.type() == AVRO_UNION) {
        throw Exception("Cannot add unions to unions");
    }

    if(typeSchema.type() == AVRO_RECORD) {
        // check for duplicate records
        size_t types = node_->leaves();
        for(size_t i = 0; i < types; ++i) {
            const NodePtr &leaf = node_->leafAt(i);
            // TODO, more checks?
            if(leaf->type() == AVRO_RECORD && leaf->name() == typeSchema.root()->name()) {
                throw Exception("Records in unions cannot have duplicate names");
            }
        }
    }

    node_->addLeaf(typeSchema.root());
}